

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<long_long,long_long>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<long_long,long_long>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,long_long>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_long_long>::b1 = true;
      __cxa_guard_release(&ComparisonTestTU<long_long,long_long>()::b1);
    }
  }
  if (ComparisonTestTU<long_long,long_long>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,long_long>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_long_long>::b2 = true;
      __cxa_guard_release(&ComparisonTestTU<long_long,long_long>()::b2);
    }
  }
  if (ComparisonTestTU<long_long,long_long>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,long_long>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_long_long>::b3 = false;
      __cxa_guard_release(&ComparisonTestTU<long_long,long_long>()::b3);
    }
  }
  if (ComparisonTestTU<long_long,long_long>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,long_long>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_long_long>::b4 = false;
      __cxa_guard_release(&ComparisonTestTU<long_long,long_long>()::b4);
    }
  }
  if (ComparisonTestTU<long_long,long_long>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,long_long>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_long_long>::b5 = false;
      __cxa_guard_release(&ComparisonTestTU<long_long,long_long>()::b5);
    }
  }
  if (ComparisonTestTU<long_long,long_long>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,long_long>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_long_long>::b6 = false;
      __cxa_guard_release(&ComparisonTestTU<long_long,long_long>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}